

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O3

Scal __thiscall LinearExpert::queryH(LinearExpert *this,Z *z,X *x)

{
  Z *this_00;
  X *this_01;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  Index index;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  double dVar11;
  Scalar SVar12;
  Scal SVar13;
  scalar_sum_op<double,_double> local_89;
  double local_88;
  undefined1 local_80 [16];
  product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  local_70;
  Scal local_58;
  undefined1 local_50 [32];
  
  this_00 = &this->dz;
  pdVar4 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar5 = (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar10 = (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if ((this->dz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      uVar10) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar10,1);
    uVar10 = (this->dz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
  }
  pdVar6 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  uVar8 = uVar10 - ((long)uVar10 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar10) {
    lVar9 = 0;
    do {
      pdVar1 = pdVar4 + lVar9;
      dVar11 = pdVar1[1];
      pdVar3 = pdVar5 + lVar9;
      dVar7 = pdVar3[1];
      pdVar2 = pdVar6 + lVar9;
      *pdVar2 = *pdVar1 - *pdVar3;
      pdVar2[1] = dVar11 - dVar7;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar8);
  }
  if ((long)uVar8 < (long)uVar10) {
    do {
      pdVar6[uVar8] = pdVar4[uVar8] - pdVar5[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  local_50._0_8_ = &this->Lambda;
  local_50._16_8_ = &this->Mu;
  local_50._8_8_ = this_00;
  Eigen::internal::
  product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       *)(local_80 + 8),(XprType *)local_50);
  local_70.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = *(Index *)local_50._16_8_;
  uVar10 = *(Index *)(local_50._16_8_ + 8);
  if ((this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != uVar10) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar10
               ,1);
    uVar10 = (this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_rows;
  }
  pdVar4 = (this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar8 = uVar10 - ((long)uVar10 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar10) {
    lVar9 = 0;
    do {
      dVar7 = ((double *)(local_80._8_8_ + lVar9 * 8))[1];
      pdVar5 = (double *)
               (local_70.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows + lVar9 * 8);
      dVar11 = pdVar5[1];
      pdVar6 = pdVar4 + lVar9;
      *pdVar6 = *(double *)(local_80._8_8_ + lVar9 * 8) + *pdVar5;
      pdVar6[1] = dVar7 + dVar11;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar8);
  }
  if ((long)uVar8 < (long)uVar10) {
    do {
      pdVar4[uVar8] =
           *(double *)(local_80._8_8_ + uVar8 * 8) +
           *(double *)
            (local_70.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows + uVar8 * 8);
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  free((void *)local_70.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d
               .data);
  this_01 = &this->dx;
  pdVar4 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar5 = (this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar10 = (this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if ((this->dx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      uVar10) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar10,1);
    uVar10 = (this->dx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
  }
  pdVar6 = (this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  uVar8 = uVar10 - ((long)uVar10 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar10) {
    lVar9 = 0;
    do {
      pdVar1 = pdVar4 + lVar9;
      dVar11 = pdVar1[1];
      pdVar3 = pdVar5 + lVar9;
      dVar7 = pdVar3[1];
      pdVar2 = pdVar6 + lVar9;
      *pdVar2 = *pdVar1 - *pdVar3;
      pdVar2[1] = dVar11 - dVar7;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar8);
  }
  if ((long)uVar8 < (long)uVar10) {
    do {
      pdVar6[uVar8] = pdVar4[uVar8] - pdVar5[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  local_50._8_8_ = &this->invSigma;
  dVar11 = -0.0;
  local_50._0_8_ = this_00;
  local_50._16_8_ = this_00;
  if ((this->invSigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows != 0) {
    local_80._8_8_ =
         (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    Eigen::internal::
    product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    ::product_evaluator(&local_70,(XprType *)(local_50 + 8));
    local_88 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const>>,3,0>
               ::
               run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
                         ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                           *)local_80,&local_89,
                          (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                           *)local_50);
    free(local_70.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    dVar11 = local_88 * -0.5;
  }
  local_88 = exp(dVar11);
  local_70.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)&this->invPsi;
  dVar11 = -0.0;
  SVar13 = this->sqrtDetInvSigma;
  local_80._8_8_ = this_01;
  if ((this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != 0) {
    local_50._16_8_ =
         (this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_50._24_8_ =
         (((X *)local_70.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
         m_storage.m_data;
    local_58 = this->sqrtDetInvSigma;
    SVar12 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
             ::
             run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_50,&local_89,
                        (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         *)local_80);
    dVar11 = SVar12 * -0.5;
    SVar13 = local_58;
  }
  local_88 = local_88 * SVar13;
  dVar11 = exp(dVar11);
  dVar11 = dVar11 * local_88 * this->sqrtDetInvPsi;
  this->h = dVar11;
  return dVar11;
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryH( Z const &z, X const &x )
{
    dz = z - Nu;
    pred_x = Lambda * dz + Mu;
    dx = x - pred_x;

    h = exp(-0.5*dz.dot(invSigma * dz)) * sqrtDetInvSigma * exp(-0.5*dx.cwiseAbs2().dot(invPsi)) * sqrtDetInvPsi;

    return h;
}